

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O3

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestRunScriptCommand::Clone(cmCTestRunScriptCommand *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  
  pp_Var2 = (_func_int **)operator_new(0x28);
  pp_Var2[1] = (_func_int *)0x0;
  pp_Var2[2] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR__cmCommand_00b1e238;
  p_Var1 = *(_func_int **)(in_RSI + 0x20);
  pp_Var2[3] = *(_func_int **)(in_RSI + 0x18);
  pp_Var2[4] = p_Var1;
  (this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand = pp_Var2;
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestRunScriptCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }